

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShader_gl_in_ArrayContentsTest::iterate(GeometryShader_gl_in_ArrayContentsTest *this)

{
  uchar *puVar1;
  deUint32 dVar2;
  int iVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ulong uVar5;
  TestLog *this_01;
  MessageBuilder *this_02;
  GLuint local_24c;
  MessageBuilder local_238;
  void *local_b8;
  GLchar *transform_feedback_data;
  GLuint po_id;
  int n_case;
  uint vec2_offset;
  uint ivec4_offset;
  uint vertex_offset;
  uint vertex_id;
  uint vec2_offset_from_vertex;
  uint ivec4_offset_from_vertex;
  GLfloat *vec2_data_ptr;
  GLint *ivec4_data_ptr;
  GLfloat local_78;
  bool result;
  uchar reference_data [72];
  Functions *gl;
  GeometryShader_gl_in_ArrayContentsTest *this_local;
  
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x191);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  reference_data._64_4_ = (*pRVar4->_vptr_RenderContext[3])();
  reference_data._68_4_ = extraout_var;
  memset(&local_78,0,0x48);
  ivec4_data_ptr._7_1_ = 1;
  vertex_id = 8;
  vertex_offset = 0;
  for (ivec4_offset = 0; ivec4_offset < 3; ivec4_offset = ivec4_offset + 1) {
    po_id = ivec4_offset * 0x18;
    n_case = po_id + 8;
    uVar5 = (ulong)(uint)n_case;
    vec2_data_ptr = (GLfloat *)((long)&local_78 + uVar5);
    _vec2_offset_from_vertex = (float *)((long)&local_78 + (ulong)po_id);
    *vec2_data_ptr = 0.0;
    *(uint *)(reference_data + (uVar5 - 4)) = ivec4_offset;
    puVar1 = reference_data + uVar5;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1 = reference_data + uVar5 + 4;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *_vec2_offset_from_vertex = (float)ivec4_offset;
    puVar1 = reference_data + ((ulong)po_id - 4);
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    vec2_offset = po_id;
  }
  (**(code **)(reference_data._64_8_ + 0x5e0))(0x8c89);
  (**(code **)(reference_data._64_8_ + 0x48))(0x8c8e,0,this->m_buffer_object_id);
  transform_feedback_data._4_4_ = 0;
  while( true ) {
    if (1 < transform_feedback_data._4_4_) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    if (transform_feedback_data._4_4_ == 0) {
      local_24c = this->m_program_object_unsized_arrays_id;
    }
    else {
      local_24c = this->m_program_object_sized_arrays_id;
    }
    transform_feedback_data._0_4_ = local_24c;
    (**(code **)(reference_data._64_8_ + 0x1680))(local_24c);
    (**(code **)(reference_data._64_8_ + 0x30))(4);
    (**(code **)(reference_data._64_8_ + 0x538))(4,0,3);
    (**(code **)(reference_data._64_8_ + 0x638))();
    dVar2 = (**(code **)(reference_data._64_8_ + 0x800))();
    glu::checkError(dVar2,"Error doing a draw call",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x1ca);
    local_b8 = (void *)(**(code **)(reference_data._64_8_ + 0xd00))(0x8c8e,0,0x48,1);
    dVar2 = (**(code **)(reference_data._64_8_ + 0x800))();
    glu::checkError(dVar2,"Could not map the buffer object into process space",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x1d0);
    iVar3 = memcmp(local_b8,&local_78,0x48);
    if (iVar3 != 0) {
      this_01 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_238,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      this_02 = tcu::MessageBuilder::operator<<
                          (&local_238,
                           (char (*) [51])"Data extracted from transform feedback is invalid.");
      tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_238);
      ivec4_data_ptr._7_1_ = 0;
    }
    (**(code **)(reference_data._64_8_ + 0x1670))(0x8c8e);
    dVar2 = (**(code **)(reference_data._64_8_ + 0x800))();
    glu::checkError(dVar2,"Error unmapping the buffer object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x1de);
    if ((ivec4_data_ptr._7_1_ & 1) != 1) break;
    transform_feedback_data._4_4_ = transform_feedback_data._4_4_ + 1;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Fail");
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShader_gl_in_ArrayContentsTest::iterate()
{
	/* This test should only run if EXT_geometry_shader is supported */
	if (true != m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	initTest();

	const glw::Functions& gl							= m_context.getRenderContext().getFunctions();
	unsigned char		  reference_data[m_buffer_size] = { 0 };
	bool				  result						= true;

	/* Prepare reference data */
	{
		glw::GLint*   ivec4_data_ptr;
		glw::GLfloat* vec2_data_ptr;

		const unsigned int ivec4_offset_from_vertex = 2 * sizeof(glw::GLfloat);
		const unsigned int vec2_offset_from_vertex  = 0;

		/* Expected data for vertex:
		 * vec2  = {VertexID, 0.0f}
		 * ivec4 = {0,        VertexID, 0, 1}
		 */
		for (unsigned int vertex_id = 0; vertex_id < m_n_vertices_emitted_per_primitive * m_n_emitted_primitives;
			 ++vertex_id)
		{
			const unsigned int vertex_offset = vertex_id * m_n_bytes_emitted_per_vertex;
			const unsigned int ivec4_offset  = vertex_offset + ivec4_offset_from_vertex;
			const unsigned int vec2_offset   = vertex_offset + vec2_offset_from_vertex;

			ivec4_data_ptr = (glw::GLint*)(reference_data + ivec4_offset);
			vec2_data_ptr  = (glw::GLfloat*)(reference_data + vec2_offset);

			ivec4_data_ptr[0] = 0;
			ivec4_data_ptr[1] = vertex_id;
			ivec4_data_ptr[2] = 0;
			ivec4_data_ptr[3] = 1;

			vec2_data_ptr[0] = (float)vertex_id;
			vec2_data_ptr[1] = 0.0f;
		}
	}

	/* Setup transform feedback */
	gl.enable(GL_RASTERIZER_DISCARD);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer_object_id);

	/* Draw the geometry */
	for (int n_case = 0; n_case < 2 /* unsized/sized array cases */; ++n_case)
	{
		glw::GLuint po_id = (n_case == 0) ? m_program_object_unsized_arrays_id : m_program_object_sized_arrays_id;

		gl.useProgram(po_id);
		gl.beginTransformFeedback(GL_TRIANGLES);
		{
			gl.drawArrays(GL_TRIANGLES, 0 /* first */, 3 /* one triangle */);
		}
		gl.endTransformFeedback();

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error doing a draw call");

		/* Map buffer object storage holding XFB result into process space. */
		glw::GLchar* transform_feedback_data = (glw::GLchar*)gl.mapBufferRange(
			GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */, m_buffer_size, GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map the buffer object into process space");

		/* Verify data extracted from transform feedback */
		if (0 != memcmp(transform_feedback_data, reference_data, m_buffer_size))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Data extracted from transform feedback is invalid."
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		/* Unmap the buffer object. */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping the buffer object");

		/* Verify results */
		if (true != result)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}